

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O3

opj_image_t * pnmtoimage(char *filename,opj_cparameters_t *parameters)

{
  OPJ_UINT32 OVar1;
  OPJ_UINT32 OVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  FILE *__stream;
  char *pcVar7;
  char *extraout_RAX;
  char *extraout_RAX_00;
  opj_image_t *poVar8;
  size_t sVar9;
  char *extraout_RAX_01;
  int iVar10;
  int iVar11;
  long lVar12;
  OPJ_INT32 OVar13;
  byte *pbVar14;
  uint uVar15;
  opj_cparameters_t *poVar16;
  uint uVar17;
  uint *out_n;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  pnm_header header_info;
  char type [256];
  opj_image_cmptparm_t cmptparm [4];
  uchar c1;
  uint local_3a4;
  uint local_398;
  uint uStack_394;
  uint local_390;
  uint local_38c;
  uint uStack_388;
  undefined1 uStack_384;
  undefined1 uStack_383;
  undefined1 uStack_382;
  undefined1 uStack_381;
  char cStack_380;
  char cStack_37f;
  undefined2 uStack_37e;
  int local_37c;
  ulong local_378;
  opj_cparameters_t *local_370;
  ulong local_368;
  ulong local_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  byte local_338;
  char cStack_337;
  char cStack_336;
  char cStack_335;
  char cStack_334;
  char cStack_333;
  char cStack_332;
  char cStack_331;
  char cStack_330;
  char cStack_32f;
  char cStack_32e;
  char cStack_32d;
  char cStack_32c;
  char cStack_32b;
  char cStack_32a;
  char cStack_329;
  undefined4 local_238;
  short sStack_234;
  undefined1 uStack_232;
  undefined1 uStack_231;
  char local_230 [16];
  uint auStack_220 [58];
  char local_138;
  char local_137 [263];
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"pnmtoimage:Failed to open %s for reading!\n",filename);
    return (opj_image_t *)0x0;
  }
  uStack_388 = 0;
  uStack_384 = 0;
  uStack_383 = 0;
  uStack_382 = 0;
  uStack_381 = 0;
  cStack_380 = '\0';
  cStack_37f = '\0';
  uStack_37e = 0;
  local_398 = 0;
  uStack_394 = 0;
  local_390 = 0;
  local_38c = 0;
  pcVar7 = fgets(&local_138,0xfa,__stream);
  local_370 = parameters;
  if (pcVar7 == (char *)0x0) {
    pnmtoimage_cold_3();
    pcVar7 = extraout_RAX;
  }
  else if (local_138 == 'P') {
    uVar4 = atoi(local_137);
    if (uVar4 - 8 < 0xfffffff9) {
      uVar4 = fprintf(_stderr,"read_pnm_header:magic format %d invalid\n",(ulong)uVar4);
      pcVar7 = (char *)(ulong)uVar4;
    }
    else {
      uStack_388 = uVar4;
      pcVar7 = fgets(&local_138,0xfa,__stream);
      bVar3 = true;
      while (pcVar7 != (char *)0x0) {
        while (uVar17 = local_398, local_138 != '#') {
          if (uVar4 != 7) {
            bVar21 = false;
            pcVar7 = &local_138;
            if ((local_398 == 0) &&
               (((pcVar7 = skip_int(&local_138,(int *)&local_398), pcVar7 == (char *)0x0 ||
                 (*pcVar7 == '\0')) || (bVar21 = true, (int)local_398 < 1)))) goto LAB_0010a0bc;
            if (uStack_394 == 0) {
              bVar21 = uVar17 == 0;
              pcVar7 = skip_int(pcVar7,(int *)&uStack_394);
              bVar22 = pcVar7 == (char *)0x0;
              if (!bVar22) {
                if ((*pcVar7 == '\0') || ((int)uStack_394 < 1)) goto LAB_0010a0bc;
                if ((uVar4 != 1) && (bVar21 = true, uVar4 != 4)) goto LAB_00109f5d;
                goto LAB_0010a041;
              }
            }
            else {
LAB_00109f5d:
              pcVar7 = skip_int(pcVar7,(int *)&local_390);
              bVar22 = pcVar7 == (char *)0x0;
              if (!bVar22) {
                if (*pcVar7 == '\0') goto LAB_0010a0bc;
                goto LAB_0010a041;
              }
            }
            if (!(bool)(bVar21 & bVar22)) goto LAB_0010a0bc;
            break;
          }
          pcVar7 = skip_idf(&local_138,(char *)&local_238);
          if ((pcVar7 == (char *)0x0) || (*pcVar7 == '\0')) goto LAB_0010a0bc;
          if (CONCAT13(uStack_232,CONCAT21(sStack_234,local_238._3_1_)) == 0x524448 &&
              local_238 == 0x48444e45) {
            bVar21 = true;
            goto LAB_0010a05a;
          }
          if (sStack_234 == 0x48 && local_238 == 0x54444957) {
            out_n = &local_398;
LAB_00109fa9:
            pcVar7 = skip_int(pcVar7,(int *)out_n);
            if ((pcVar7 == (char *)0x0) || (*pcVar7 == '\0')) goto LAB_0010a0bc;
            break;
          }
          if (CONCAT13(uStack_232,CONCAT21(sStack_234,local_238._3_1_)) == 0x544847 &&
              local_238 == 0x47494548) {
            out_n = &uStack_394;
            goto LAB_00109fa9;
          }
          if (sStack_234 == 0x48 && local_238 == 0x54504544) {
            out_n = &local_38c;
            goto LAB_00109fa9;
          }
          if (CONCAT13(uStack_232,CONCAT21(sStack_234,local_238._3_1_)) == 0x4c4156 &&
              local_238 == 0x5658414d) {
            out_n = &local_390;
            goto LAB_00109fa9;
          }
          if (local_230[0] != '\0' ||
              CONCAT17(uStack_231,CONCAT16(uStack_232,CONCAT24(sStack_234,local_238))) !=
              0x455059544c505554) {
            pcVar7 = "read_pnm_header:unknown P7 idf %s\n";
            pbVar14 = (byte *)&local_238;
LAB_0010a731:
            uVar4 = fprintf(_stderr,pcVar7,pbVar14);
            pcVar7 = (char *)(ulong)uVar4;
            goto LAB_0010a0bc;
          }
          pcVar7 = skip_idf(pcVar7,(char *)&local_338);
          if ((pcVar7 == (char *)0x0) || (*pcVar7 == '\0')) goto LAB_0010a0bc;
          if (CONCAT17(cStack_32b,
                       CONCAT16(cStack_32c,
                                CONCAT15(cStack_32d,
                                         CONCAT14(cStack_32e,
                                                  CONCAT13(cStack_32f,
                                                           CONCAT12(cStack_330,
                                                                    CONCAT11(cStack_331,cStack_332))
                                                          ))))) == 0x4554494857444e &&
              CONCAT17(cStack_331,
                       CONCAT16(cStack_332,
                                CONCAT15(cStack_333,
                                         CONCAT14(cStack_334,
                                                  CONCAT13(cStack_335,
                                                           CONCAT12(cStack_336,
                                                                    CONCAT11(cStack_337,local_338)))
                                                 )))) == 0x444e414b43414c42) {
            cStack_380 = '\x01';
          }
          else if (CONCAT11(cStack_32f,cStack_330) == 0x45 &&
                   CONCAT17(cStack_331,
                            CONCAT16(cStack_332,
                                     CONCAT15(cStack_333,
                                              CONCAT14(cStack_334,
                                                       CONCAT13(cStack_335,
                                                                CONCAT12(cStack_336,
                                                                         CONCAT11(cStack_337,
                                                                                  local_338)))))))
                   == 0x4c41435359415247) {
            uStack_382 = 1;
          }
          else {
            auVar24[0] = -(local_338 == 'G');
            auVar24[1] = -(cStack_337 == 'R');
            auVar24[2] = -(cStack_336 == 'A');
            auVar24[3] = -(cStack_335 == 'Y');
            auVar24[4] = -(cStack_334 == 'S');
            auVar24[5] = -(cStack_333 == 'C');
            auVar24[6] = -(cStack_332 == 'A');
            auVar24[7] = -(cStack_331 == 'L');
            auVar24[8] = -(cStack_330 == 'E');
            auVar24[9] = -(cStack_32f == '_');
            auVar24[10] = -(cStack_32e == 'A');
            auVar24[0xb] = -(cStack_32d == 'L');
            auVar24[0xc] = -(cStack_32c == 'P');
            auVar24[0xd] = -(cStack_32b == 'H');
            auVar24[0xe] = -(cStack_32a == 'A');
            auVar24[0xf] = -(cStack_329 == '\0');
            if ((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar24[0xf] >> 7) << 0xf) == 0xffff) {
              uStack_381 = 1;
            }
            else if (CONCAT13(cStack_335,CONCAT12(cStack_336,CONCAT11(cStack_337,local_338))) ==
                     0x424752) {
              uStack_384 = 1;
            }
            else {
              if (CONCAT11(cStack_32f,cStack_330) != 0x41 ||
                  CONCAT17(cStack_331,
                           CONCAT16(cStack_332,
                                    CONCAT15(cStack_333,
                                             CONCAT14(cStack_334,
                                                      CONCAT13(cStack_335,
                                                               CONCAT12(cStack_336,
                                                                        CONCAT11(cStack_337,
                                                                                 local_338))))))) !=
                  0x48504c415f424752) {
                pcVar7 = "read_pnm_header:unknown P7 TUPLTYPE %s\n";
                pbVar14 = &local_338;
                goto LAB_0010a731;
              }
              uStack_383 = 1;
            }
          }
          pcVar7 = fgets(&local_138,0xfa,__stream);
          bVar3 = false;
          bVar21 = false;
          if (pcVar7 == (char *)0x0) goto LAB_0010a05a;
        }
        pcVar7 = fgets(&local_138,0xfa,__stream);
      }
LAB_0010a041:
      bVar23 = (uVar4 & 6) != 2;
      pcVar7 = (char *)(ulong)bVar23;
      bVar22 = false;
      bVar21 = false;
      if (4 < (int)uVar4 || !bVar23) {
LAB_0010a05a:
        bVar22 = bVar21;
        pcVar7 = (char *)(ulong)(local_390 - 0x10000);
        if (local_390 - 0x10000 < 0xffff0001) goto LAB_0010a0bc;
      }
      if ((0 < (int)local_398) && (0 < (int)uStack_394)) {
        if (uVar4 == 7) {
          if (bVar22) {
            uVar4 = local_38c - 5;
            pcVar7 = (char *)(ulong)CONCAT31((int3)(uVar4 >> 8),uVar4 < 0xfffffffc);
            if (!bVar3 && uVar4 >= 0xfffffffc) {
              cStack_37f = '\x01';
            }
          }
          else {
            pnmtoimage_cold_2();
            pcVar7 = extraout_RAX_01;
          }
        }
        else {
          cStack_37f = '\x01';
          if ((uVar4 == 4) || (uVar4 == 1)) {
            local_390 = 0xff;
          }
        }
      }
    }
  }
  else {
    pnmtoimage_cold_1();
    pcVar7 = extraout_RAX_00;
  }
LAB_0010a0bc:
  poVar16 = local_370;
  uVar4 = uStack_388;
  if (cStack_37f == '\0') {
LAB_0010a0f8:
    fclose(__stream);
    return (opj_image_t *)0x0;
  }
  auVar25._0_4_ = -(uint)(local_398 == 0);
  auVar25._4_4_ = -(uint)(local_398 == 0);
  auVar25._8_4_ = -(uint)(uStack_394 == 0);
  auVar25._12_4_ = -(uint)(uStack_394 == 0);
  iVar5 = movmskpd((int)pcVar7,auVar25);
  if ((iVar5 != 0) || (local_3a4 = local_38c, uStack_388 == 7 && local_38c == 0)) goto LAB_0010a0f8;
  if ((int)(0x7fffffff / (long)(int)uStack_394) < (int)local_398) {
    poVar8 = (opj_image_t *)0x0;
    fprintf(_stderr,"pnmtoimage:Image %dx%d too big!\n");
    goto LAB_0010a6d0;
  }
  if (7 < uStack_388) goto LAB_0010a0f8;
  if ((0x36U >> (uStack_388 & 0x1f) & 1) == 0) {
    if ((0x48U >> (uStack_388 & 0x1f) & 1) == 0) {
      if (uStack_388 != 7) goto LAB_0010a0f8;
      local_37c = ((int)local_38c < 3) + 1;
    }
    else {
      local_37c = 1;
      local_3a4 = 3;
    }
  }
  else {
    local_37c = 2;
    local_3a4 = 1;
  }
  uStack_340 = 0;
  uVar17 = 1;
  if ((((((1 < (int)local_390) && (uVar17 = 2, 3 < local_390)) && (uVar17 = 3, 7 < local_390)) &&
       ((uVar17 = 4, 0xf < local_390 && (uVar17 = 5, 0x1f < local_390)))) &&
      (((uVar17 = 6, 0x3f < local_390 &&
        ((uVar17 = 7, 0x7f < local_390 && (uVar17 = 8, 0xff < local_390)))) &&
       (uVar17 = 9, 0x1ff < local_390)))) &&
     ((((uVar17 = 10, 0x3ff < local_390 && (uVar17 = 0xb, 0x7ff < local_390)) &&
       (uVar17 = 0xc, 0xfff < local_390)) &&
      ((uVar17 = 0xd, 0x1fff < local_390 && (uVar17 = 0xe, 0x3fff < local_390)))))) {
    uVar17 = 0x10 - (local_390 < 0x8000);
  }
  local_378 = CONCAT44(local_378._4_4_,local_390);
  uVar15 = 8;
  if (8 < uVar17) {
    uVar15 = uVar17;
  }
  local_358._0_4_ = local_370->subsampling_dx;
  local_358._4_4_ = local_370->subsampling_dy;
  uStack_350 = 0;
  local_368 = (ulong)uStack_394;
  local_360 = (ulong)local_398;
  local_348 = CONCAT44(uStack_394,local_398);
  memset(&local_238,0,(long)(int)local_3a4 * 0x24);
  if (0 < (int)local_3a4) {
    lVar12 = 0;
    do {
      *(uint *)((long)auStack_220 + lVar12) = uVar15;
      *(uint *)((long)auStack_220 + lVar12 + 4) = uVar15;
      *(undefined4 *)((long)auStack_220 + lVar12 + 8) = 0;
      *(undefined8 *)((long)&local_238 + lVar12) = local_358;
      *(undefined8 *)(local_230 + lVar12) = local_348;
      lVar12 = lVar12 + 0x24;
    } while ((ulong)local_3a4 * 0x24 != lVar12);
  }
  poVar8 = (opj_image_t *)opj_image_create(local_3a4,&local_238,local_37c);
  if (poVar8 == (opj_image_t *)0x0) goto LAB_0010a0f8;
  OVar1 = poVar16->image_offset_x0;
  poVar8->x0 = OVar1;
  OVar2 = poVar16->image_offset_y0;
  poVar8->y0 = OVar2;
  iVar5 = (int)local_360;
  poVar8->x1 = (int)local_358 * (iVar5 + -1) + OVar1 + 1;
  iVar6 = (int)local_368;
  poVar8->y1 = OVar2 + local_358._4_4_ * (iVar6 + -1) + 1;
  if ((uVar4 & 0xfffffffe) == 2) {
    if (0 < iVar6 * iVar5) {
      local_370 = (opj_cparameters_t *)(ulong)(uint)(iVar6 * iVar5);
      poVar16 = (opj_cparameters_t *)0x0;
      do {
        if (0 < (int)local_3a4) {
          lVar12 = 0;
          do {
            local_338 = 0;
            cStack_337 = '\0';
            cStack_336 = '\0';
            cStack_335 = '\0';
            iVar5 = __isoc99_fscanf(__stream,"%u",&local_338);
            if (iVar5 != 1) {
              pnmtoimage_cold_7();
              return (opj_image_t *)0x0;
            }
            *(int *)(*(long *)((long)&poVar8->comps->data + lVar12) + (long)poVar16 * 4) =
                 (CONCAT13(cStack_335,CONCAT12(cStack_336,CONCAT11(cStack_337,local_338))) * 0xff) /
                 (int)local_378;
            lVar12 = lVar12 + 0x40;
          } while ((ulong)local_3a4 << 6 != lVar12);
        }
        poVar16 = (opj_cparameters_t *)((long)&poVar16->tile_size_on + 1);
      } while (poVar16 != local_370);
    }
    goto LAB_0010a6d0;
  }
  if (1 < uVar4 - 5) {
    if (uVar4 != 7) {
      if (uVar4 == 1) {
        if (0 < iVar6 * iVar5) {
          uVar20 = 0;
          do {
            iVar10 = __isoc99_fscanf(__stream,"%u",&local_338);
            if (iVar10 != 1) {
              pnmtoimage_cold_5();
              return (opj_image_t *)0x0;
            }
            OVar13 = 0;
            if (CONCAT13(cStack_335,CONCAT12(cStack_336,CONCAT11(cStack_337,local_338))) == 0) {
              OVar13 = 0xff;
            }
            poVar8->comps->data[uVar20] = OVar13;
            uVar20 = uVar20 + 1;
          } while ((uint)(iVar6 * iVar5) != uVar20);
        }
      }
      else if ((uVar4 == 4) && (0 < iVar6)) {
        iVar6 = 0;
        iVar10 = 0;
        uVar20 = local_368;
        uVar18 = local_360;
        do {
          if (0 < (int)uVar18) {
            local_378 = CONCAT44(local_378._4_4_,iVar6);
            lVar12 = (long)iVar10;
            iVar11 = -1;
            iVar19 = 0;
            iVar6 = 0;
            do {
              if (iVar11 == -1) {
                iVar6 = getc(__stream);
                if (iVar6 == -1) {
                  pnmtoimage_cold_4();
                  return (opj_image_t *)0x0;
                }
                iVar11 = 7;
              }
              OVar13 = 0;
              if ((byte)((byte)iVar6 & (byte)(1 << ((byte)iVar11 & 0x1f))) == 0) {
                OVar13 = 0xff;
              }
              poVar8->comps->data[lVar12] = OVar13;
              iVar11 = iVar11 + -1;
              lVar12 = lVar12 + 1;
              iVar19 = iVar19 + -1;
            } while (-iVar5 != iVar19);
            iVar10 = iVar10 - iVar19;
            uVar20 = local_368;
            uVar18 = local_360;
            iVar6 = (int)local_378;
          }
          iVar6 = iVar6 + 1;
        } while (iVar6 != (int)uVar20);
      }
      goto LAB_0010a6d0;
    }
    if (CONCAT13(uStack_381,CONCAT12(uStack_382,CONCAT11(uStack_383,uStack_384))) == 0) {
      if ((cStack_380 != '\0') && (0 < iVar6 * iVar5)) {
        uVar20 = 0;
        do {
          sVar9 = fread(&local_338,1,1,__stream);
          if (sVar9 == 0) {
            pnmtoimage_cold_6();
            return (opj_image_t *)0x0;
          }
          OVar13 = 0;
          if ((local_338 & 1) == 0) {
            OVar13 = 0xff;
          }
          poVar8->comps->data[uVar20] = OVar13;
          uVar20 = uVar20 + 1;
        } while ((uint)(iVar6 * iVar5) != uVar20);
      }
      goto LAB_0010a6d0;
    }
  }
  if (0 < iVar6 * iVar5) {
    local_378 = (ulong)(uint)(iVar6 * iVar5);
    uVar20 = 0;
    do {
      if (0 < (int)local_3a4) {
        lVar12 = 0;
        do {
          sVar9 = fread(&local_338,1,1,__stream);
          if (sVar9 == 0) {
LAB_0010a503:
            fwrite("Missing data. Quitting.\n",0x18,1,_stderr);
            opj_image_destroy(poVar8);
            goto LAB_0010a0f8;
          }
          if (uVar17 < 9) {
            uVar4 = (uint)local_338;
          }
          else {
            sVar9 = fread(&local_138,1,1,__stream);
            if (sVar9 == 0) goto LAB_0010a503;
            uVar4 = (uint)CONCAT11(local_338,local_138);
          }
          *(uint *)(*(long *)((long)&poVar8->comps->data + lVar12) + uVar20 * 4) = uVar4;
          lVar12 = lVar12 + 0x40;
        } while ((ulong)local_3a4 << 6 != lVar12);
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 != local_378);
  }
LAB_0010a6d0:
  fclose(__stream);
  return poVar8;
}

Assistant:

opj_image_t* pnmtoimage(const char *filename, opj_cparameters_t *parameters)
{
    int subsampling_dx = parameters->subsampling_dx;
    int subsampling_dy = parameters->subsampling_dy;

    FILE *fp = NULL;
    int i, compno, numcomps, w, h, prec, format;
    OPJ_COLOR_SPACE color_space;
    opj_image_cmptparm_t cmptparm[4]; /* RGBA: max. 4 components */
    opj_image_t * image = NULL;
    struct pnm_header header_info;

    if ((fp = fopen(filename, "rb")) == NULL) {
        fprintf(stderr, "pnmtoimage:Failed to open %s for reading!\n", filename);
        return NULL;
    }
    memset(&header_info, 0, sizeof(struct pnm_header));

    read_pnm_header(fp, &header_info);

    if (!header_info.ok) {
        fclose(fp);
        return NULL;
    }

    if (header_info.width == 0
            || header_info.height == 0
            || (header_info.format == 7 && header_info.depth == 0)) {
        fclose(fp);
        return NULL;
    }

    /* This limitation could be removed by making sure to use size_t below */
    if (header_info.height != 0 &&
            header_info.width > INT_MAX / header_info.height) {
        fprintf(stderr, "pnmtoimage:Image %dx%d too big!\n",
                header_info.width, header_info.height);
        fclose(fp);
        return NULL;
    }

    format = header_info.format;

    switch (format) {
    case 1: /* ascii bitmap */
    case 4: /* raw bitmap */
        numcomps = 1;
        break;

    case 2: /* ascii greymap */
    case 5: /* raw greymap */
        numcomps = 1;
        break;

    case 3: /* ascii pixmap */
    case 6: /* raw pixmap */
        numcomps = 3;
        break;

    case 7: /* arbitrary map */
        numcomps = header_info.depth;
        break;

    default:
        fclose(fp);
        return NULL;
    }
    if (numcomps < 3) {
        color_space = OPJ_CLRSPC_GRAY;    /* GRAY, GRAYA */
    } else {
        color_space = OPJ_CLRSPC_SRGB;    /* RGB, RGBA */
    }

    prec = has_prec(header_info.maxval);

    if (prec < 8) {
        prec = 8;
    }

    w = header_info.width;
    h = header_info.height;
    subsampling_dx = parameters->subsampling_dx;
    subsampling_dy = parameters->subsampling_dy;

    memset(&cmptparm[0], 0, (size_t)numcomps * sizeof(opj_image_cmptparm_t));

    for (i = 0; i < numcomps; i++) {
        cmptparm[i].prec = (OPJ_UINT32)prec;
        cmptparm[i].bpp = (OPJ_UINT32)prec;
        cmptparm[i].sgnd = 0;
        cmptparm[i].dx = (OPJ_UINT32)subsampling_dx;
        cmptparm[i].dy = (OPJ_UINT32)subsampling_dy;
        cmptparm[i].w = (OPJ_UINT32)w;
        cmptparm[i].h = (OPJ_UINT32)h;
    }
    image = opj_image_create((OPJ_UINT32)numcomps, &cmptparm[0], color_space);

    if (!image) {
        fclose(fp);
        return NULL;
    }

    /* set image offset and reference grid */
    image->x0 = (OPJ_UINT32)parameters->image_offset_x0;
    image->y0 = (OPJ_UINT32)parameters->image_offset_y0;
    image->x1 = (OPJ_UINT32)(parameters->image_offset_x0 + (w - 1) * subsampling_dx
                             + 1);
    image->y1 = (OPJ_UINT32)(parameters->image_offset_y0 + (h - 1) * subsampling_dy
                             + 1);

    if ((format == 2) || (format == 3)) { /* ascii pixmap */
        unsigned int index;

        for (i = 0; i < w * h; i++) {
            for (compno = 0; compno < numcomps; compno++) {
                index = 0;
                if (fscanf(fp, "%u", &index) != 1) {
                    fprintf(stderr, "Missing data. Quitting.\n");
                    opj_image_destroy(image);
                    fclose(fp);
                    return NULL;
                }

                image->comps[compno].data[i] = (OPJ_INT32)(index * 255) / header_info.maxval;
            }
        }
    } else if ((format == 5)
               || (format == 6)
               || ((format == 7)
                   && (header_info.gray || header_info.graya
                       || header_info.rgb || header_info.rgba))) { /* binary pixmap */
        unsigned char c0, c1, one;

        one = (prec < 9);

        for (i = 0; i < w * h; i++) {
            for (compno = 0; compno < numcomps; compno++) {
                if (!fread(&c0, 1, 1, fp)) {
                    fprintf(stderr, "Missing data. Quitting.\n");
                    opj_image_destroy(image);
                    fclose(fp);
                    return NULL;
                }
                if (one) {
                    image->comps[compno].data[i] = c0;
                } else {
                    if (!fread(&c1, 1, 1, fp)) {
                        fprintf(stderr, "Missing data. Quitting.\n");
                        opj_image_destroy(image);
                        fclose(fp);
                        return NULL;
                    }
                    /* netpbm: */
                    image->comps[compno].data[i] = ((c0 << 8) | c1);
                }
            }
        }
    } else if (format == 1) { /* ascii bitmap */
        for (i = 0; i < w * h; i++) {
            unsigned int index;

            if (fscanf(fp, "%u", &index) != 1) {
                fprintf(stderr, "Missing data. Quitting.\n");
                opj_image_destroy(image);
                fclose(fp);
                return NULL;
            }

            image->comps[0].data[i] = (index ? 0 : 255);
        }
    } else if (format == 4) {
        int x, y, bit;
        int uc;

        i = 0;
        for (y = 0; y < h; ++y) {
            bit = -1;
            uc = 0;

            for (x = 0; x < w; ++x) {
                if (bit == -1) {
                    bit = 7;
                    uc = getc(fp);
                    if (uc == EOF) {
                        fprintf(stderr, "Missing data. Quitting.\n");
                        opj_image_destroy(image);
                        fclose(fp);
                        return NULL;
                    }
                }
                image->comps[0].data[i] = ((((unsigned char)uc >> bit) & 1) ? 0 : 255);
                --bit;
                ++i;
            }
        }
    } else if ((format == 7 && header_info.bw)) { /*MONO*/
        unsigned char uc;

        for (i = 0; i < w * h; ++i) {
            if (!fread(&uc, 1, 1, fp)) {
                fprintf(stderr, "Missing data. Quitting.\n");
                opj_image_destroy(image);
                fclose(fp);
                return NULL;
            }
            image->comps[0].data[i] = (uc & 1) ? 0 : 255;
        }
    }
    fclose(fp);

    return image;
}